

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

string * __thiscall
libcellml::Importer::ImporterImpl::resolvingUrl_abi_cxx11_
          (string *__return_storage_ptr__,ImporterImpl *this,ImportSourcePtr *importSource)

{
  ModelPtr model;
  ModelPtr local_30;
  
  ImportSource::model((ImportSource *)&local_30);
  if (local_30.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    ImportSource::url_abi_cxx11_
              (__return_storage_ptr__,
               (importSource->
               super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    modelUrl_abi_cxx11_(__return_storage_ptr__,this,&local_30);
  }
  if (local_30.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Importer::ImporterImpl::resolvingUrl(const ImportSourcePtr &importSource) const
{
    auto model = importSource->model();
    if (model == nullptr) {
        return importSource->url();
    }

    return modelUrl(model);
}